

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_text(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *this,iterator begin,iterator end)

{
  type n;
  type __result;
  iterator out;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> local_30;
  
  n = internal::to_unsigned<long>((long)end.ptr_ - (long)begin.ptr_);
  local_30.container =
       (this->context).
       super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
       .out_.container;
  __result = internal::reserve<fmt::v5::internal::basic_buffer<char>>(&local_30,n);
  std::copy_n<fmt::v5::internal::null_terminating_iterator<char>,unsigned_long,char*>
            (begin,n,__result);
  (this->context).
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  .out_.container = local_30.container;
  return;
}

Assistant:

void on_text(iterator begin, iterator end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }